

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Gl_Device_Plugin.cxx
# Opt level: O1

int __thiscall
Fl_Gl_Device_Plugin::print(Fl_Gl_Device_Plugin *this,Fl_Widget *w,int x,int y,int height)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  Fl_RGB_Image *pFVar3;
  Fl_Gl_Window *glw;
  
  iVar2 = (*w->_vptr_Fl_Widget[9])(w);
  glw = (Fl_Gl_Window *)CONCAT44(extraout_var,iVar2);
  if (glw == (Fl_Gl_Window *)0x0) {
    iVar2 = 0;
  }
  else {
    pFVar3 = capture_gl_rectangle
                       (glw,0,0,(glw->super_Fl_Window).super_Fl_Group.super_Fl_Widget.w_,
                        (glw->super_Fl_Window).super_Fl_Group.super_Fl_Widget.h_);
    iVar2 = (pFVar3->super_Fl_Image).ld_;
    if (iVar2 == 0) {
      iVar2 = (pFVar3->super_Fl_Image).d_ * (pFVar3->super_Fl_Image).w_;
    }
    uVar1 = (pFVar3->super_Fl_Image).h_;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2f])
              (fl_graphics_driver,pFVar3->array + (int)((uVar1 - 1) * iVar2),(ulong)(uint)x,
               (ulong)(uint)y,(ulong)(uint)(pFVar3->super_Fl_Image).w_,(ulong)uVar1,3,
               (ulong)(uint)-iVar2);
    (*(pFVar3->super_Fl_Image)._vptr_Fl_Image[1])(pFVar3);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

virtual int print(Fl_Widget *w, int x, int y, int height /*useless*/) {
    Fl_Gl_Window *glw = w->as_gl_window();
    if (!glw) return 0;
    Fl_RGB_Image *img = capture_gl_rectangle(glw, 0, 0, glw->w(), glw->h());
#ifdef __APPLE__
    if (Fl_Surface_Device::surface()->class_name() == Fl_Printer::class_id) {
      // convert the image to CGImage, and draw it at full res (useful on retina display)
      CGColorSpaceRef cSpace = CGColorSpaceCreateDeviceRGB();
      CGDataProviderRef provider = CGDataProviderCreateWithData(img, img->array, img->ld() * img->h(), imgProviderReleaseData);
      CGImageRef cgimg = CGImageCreate(img->w(), img->h(), 8, 24, img->ld(), cSpace,
                                     (CGBitmapInfo)(kCGImageAlphaNone),
                                     provider, NULL, false, kCGRenderingIntentDefault);
      CGColorSpaceRelease(cSpace);
      CGDataProviderRelease(provider);
      CGContextDrawImage(fl_gc, CGRectMake(0, 0, glw->w(), glw->h()), cgimg);
      CFRelease(cgimg);
      return 1;
    } else if (img->w() > glw->w()) {
      Fl_RGB_Image *img2 = (Fl_RGB_Image*)img->copy(glw->w(), glw->h());
      delete img;
      img = img2;
    }
#endif
    int ld = img->ld() ? img->ld() : img->w() * img->d();
    fl_draw_image(img->array + (img->h() - 1) * ld, x, y , img->w(), img->h(), 3, - ld);
    delete img;
    return 1;
  }